

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

exception<ki::protocol::parse_error> *
pybind11::register_exception<ki::protocol::parse_error>(handle scope,char *name,PyObject *base)

{
  bool bVar1;
  anon_class_1_0_00000001 local_39;
  char *local_38;
  exception<ki::protocol::parse_error> local_30;
  handle *local_28;
  exception<ki::protocol::parse_error> *ex;
  PyObject *base_local;
  char *name_local;
  handle scope_local;
  
  ex = (exception<ki::protocol::parse_error> *)base;
  base_local = (PyObject *)name;
  name_local = (char *)scope.m_ptr;
  local_28 = (handle *)detail::get_exception_object<ki::protocol::parse_error>();
  bVar1 = handle::operator_cast_to_bool(local_28);
  if (!bVar1) {
    local_38 = name_local;
    exception<ki::protocol::parse_error>::exception
              (&local_30,(handle)name_local,(char *)base_local,(PyObject *)ex);
    exception<ki::protocol::parse_error>::operator=
              ((exception<ki::protocol::parse_error> *)local_28,&local_30);
    exception<ki::protocol::parse_error>::~exception(&local_30);
  }
  register_exception_translator<pybind11::register_exception<ki::protocol::parse_error>(pybind11::handle,char_const*,_object*)::_lambda(std::__exception_ptr::exception_ptr)_1_>
            (&local_39);
  return (exception<ki::protocol::parse_error> *)local_28;
}

Assistant:

exception<CppException> &register_exception(handle scope,
                                            const char *name,
                                            PyObject *base = PyExc_Exception) {
    auto &ex = detail::get_exception_object<CppException>();
    if (!ex) ex = exception<CppException>(scope, name, base);

    register_exception_translator([](std::exception_ptr p) {
        if (!p) return;
        try {
            std::rethrow_exception(p);
        } catch (const CppException &e) {
            detail::get_exception_object<CppException>()(e.what());
        }
    });
    return ex;
}